

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natives.c
# Opt level: O0

void ch_native_string_contains(ch_context *vm,ch_argcount argcount)

{
  _Bool _Var1;
  ch_primitive primitive;
  undefined7 uStack_37;
  ch_string *pcStack_28;
  _Bool contains;
  ch_string *haystack;
  ch_string *needle;
  ch_context *pcStack_10;
  ch_argcount argcount_local;
  ch_context *vm_local;
  
  needle._7_1_ = argcount;
  pcStack_10 = vm;
  _Var1 = ch_checkargcount(vm,'\x02',argcount);
  if (((_Var1) && (_Var1 = ch_popstring(pcStack_10,&haystack), _Var1)) &&
     (_Var1 = ch_popstring(pcStack_10,&stack0xffffffffffffffd8), _Var1)) {
    _Var1 = ch_containsstring(pcStack_10,pcStack_28,haystack);
    primitive.field_1._1_7_ = uStack_37;
    primitive.field_1.boolean_value = _Var1;
    primitive._0_8_ = 1;
    ch_push(pcStack_10,primitive);
  }
  return;
}

Assistant:

void ch_native_string_contains(ch_context* vm, ch_argcount argcount) {
	if (!ch_checkargcount(vm, 2, argcount)) return;

	ch_string* needle;
	if(!ch_popstring(vm, &needle)) return;

	ch_string* haystack;
	if(!ch_popstring(vm, &haystack)) return;

	bool contains = ch_containsstring(vm, haystack, needle);
	ch_push(vm, MAKE_BOOLEAN(contains));
}